

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_compression.cc
# Opt level: O0

bool anon_unknown.dwarf_39b09c::DecodePointCompressed
               (Decoder *decoder,int level,NthDerivativeCoder *pi_coder,NthDerivativeCoder *qi_coder
               ,pair<int,_int> *vertex_pi_qi)

{
  pair<int,_int> *this;
  NthDerivativeCoder *this_00;
  bool bVar1;
  int32 iVar2;
  uint32 local_48;
  uint32 local_44;
  uint32 zig_zag_encoded_deriv_qi;
  uint32 zig_zag_encoded_deriv_pi;
  uint64 interleaved_zig_zag_encoded_deriv_pi_qi;
  pair<int,_int> *vertex_pi_qi_local;
  NthDerivativeCoder *qi_coder_local;
  NthDerivativeCoder *pi_coder_local;
  Decoder *pDStack_18;
  int level_local;
  Decoder *decoder_local;
  
  interleaved_zig_zag_encoded_deriv_pi_qi = (uint64)vertex_pi_qi;
  vertex_pi_qi_local = (pair<int,_int> *)qi_coder;
  qi_coder_local = pi_coder;
  pi_coder_local._4_4_ = level;
  pDStack_18 = decoder;
  bVar1 = Decoder::get_varint64(decoder,(uint64 *)&zig_zag_encoded_deriv_qi);
  if (bVar1) {
    util_bits::DeinterleaveUint32(_zig_zag_encoded_deriv_qi,&local_44,&local_48);
    this_00 = qi_coder_local;
    iVar2 = ZigZagDecode(local_44);
    iVar2 = NthDerivativeCoder::Decode(this_00,iVar2);
    this = vertex_pi_qi_local;
    *(int32 *)interleaved_zig_zag_encoded_deriv_pi_qi = iVar2;
    iVar2 = ZigZagDecode(local_48);
    iVar2 = NthDerivativeCoder::Decode((NthDerivativeCoder *)this,iVar2);
    *(int32 *)(interleaved_zig_zag_encoded_deriv_pi_qi + 4) = iVar2;
  }
  return bVar1;
}

Assistant:

bool DecodePointCompressed(Decoder* decoder,
                           int level,
                           NthDerivativeCoder* pi_coder,
                           NthDerivativeCoder* qi_coder,
                           pair<int, int>* vertex_pi_qi) {
  uint64 interleaved_zig_zag_encoded_deriv_pi_qi;
  if (!decoder->get_varint64(&interleaved_zig_zag_encoded_deriv_pi_qi)) {
    return false;
  }

  uint32 zig_zag_encoded_deriv_pi, zig_zag_encoded_deriv_qi;
  util_bits::DeinterleaveUint32(interleaved_zig_zag_encoded_deriv_pi_qi,
                                &zig_zag_encoded_deriv_pi,
                                &zig_zag_encoded_deriv_qi);

  vertex_pi_qi->first =
      pi_coder->Decode(ZigZagDecode(zig_zag_encoded_deriv_pi));
  vertex_pi_qi->second =
      qi_coder->Decode(ZigZagDecode(zig_zag_encoded_deriv_qi));

  return true;
}